

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist_args.cpp
# Opt level: O2

bool node::ShouldPersistMempool(ArgsManager *argsman)

{
  bool bVar1;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"-persistmempool",&local_39);
  bVar1 = ArgsManager::GetBoolArg(argsman,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ShouldPersistMempool(const ArgsManager& argsman)
{
    return argsman.GetBoolArg("-persistmempool", DEFAULT_PERSIST_MEMPOOL);
}